

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *con,int param_2)

{
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  double dVar5;
  type tVar6;
  bool bVar7;
  ConstraintAcceptanceLevel CVar8;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  byte bVar9;
  int v;
  VarOrConst VVar10;
  NodeRange NVar11;
  AlgConRange rng;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> lc;
  LinTerms lt;
  QuadraticFunctionalConstraint exprTerm;
  int local_54c;
  NLConstraint local_548;
  undefined1 local_478 [104];
  type local_410;
  type local_408;
  undefined1 local_3f8 [24];
  AlgConRhs<_1> local_3e0;
  NLConstraint local_3d8;
  undefined1 local_308 [72];
  int *local_2c0;
  ulong local_2b8;
  size_ty local_2b0;
  int local_2a8 [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  ulong local_288;
  ulong local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [3];
  type local_248;
  type local_240;
  type local_238;
  undefined1 local_230 [24];
  QuadraticFunctionalConstraint local_218;
  
  local_308._0_8_ = local_308 + 0x18;
  local_308._8_8_ = 6;
  local_308._16_8_ = 0;
  local_2b8 = 6;
  local_2c0 = local_2a8;
  local_2b0 = 0;
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (&local_218,
             (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_QuadAndLinTerms,(LinTerms *)local_308);
  dVar5 = (con->super_AlgConRhs<_1>).rhs_;
  if ((local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
       super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_size == 1 &&
      local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      == 0) && local_218.quad_expr_.constant_term_ == 0.0) {
    if ((*local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr != 1.0) ||
       (NAN(*local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr))) {
LAB_00187231:
      if ((ulong)local_218.super_FunctionalConstraint.ctx.value_ < 3) {
        local_218.super_FunctionalConstraint.ctx.value_ =
             *(CtxVal *)(&DAT_00381a10 + (ulong)local_218.super_FunctionalConstraint.ctx.value_ * 4)
        ;
      }
      VVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::AssignResult2Args<mp::QuadraticFunctionalConstraint>
                         ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)(this + -0x208),&local_218);
      value = VVar10.field_1;
      if (((undefined1  [16])VVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        NVar11 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)(this + -0x208),value.c_);
        value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar11.ir_;
      }
    }
    else {
      value._4_4_ = 0;
      value.var_ = *local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    }
    v = value.var_;
    if (v < 0) goto LAB_001873ea;
    if ((*(int *)(this + -0x140) - *(int *)(this + -0x150)) * 8 + *(int *)(this + -0x138) <= v) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 false);
    }
    CVar8 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                      ((BasicConstraintKeeper *)(this + 0x6e40));
    if (CVar8 != Recommended) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 true);
    }
    this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this + -0x208);
    bVar7 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    if (!bVar7) goto LAB_00187406;
    local_548.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)0x3ff0000000000000;
    local_54c = v;
    gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
              ((small_vector_base<std::allocator<double>,6u> *)local_308,(double *)&local_548);
    gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
              ((small_vector_base<std::allocator<int>,6u> *)&local_2c0,&local_54c);
    LinTerms::sort_terms((LinTerms *)local_308,true);
    if ((ulong)local_308._16_8_ < 2) {
      bVar7 = true;
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds(this_00,v,-INFINITY,dVar5);
      goto LAB_0018770b;
    }
    CVar8 = BasicConstraintKeeper::GetChosenAcceptanceLevel((BasicConstraintKeeper *)(this + 0xb28))
    ;
    if (CVar8 != Recommended) {
      v = -1;
      bVar9 = 1;
      goto LAB_001873ec;
    }
    gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<double>,6u> *)&local_290,local_308);
    gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<int>,6u> *)&local_248,
               (small_vector_base<std::allocator<int>,6u> *)&local_2c0);
    local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity = local_280;
    dVar5 = (con->super_AlgConRhs<_1>).rhs_;
    paVar1 = &local_548.super_BasicConstraint.name_.field_2;
    local_548.super_BasicConstraint.name_._M_string_length = 0;
    local_548.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    local_548.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
    if (local_288 < 7) {
      local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)((long)&local_548.lcr_.super_BasicConstraint.name_.field_2 + 8);
      local_548.lcr_.super_BasicConstraint.name_._M_string_length = 6;
      if (local_280 != 0) {
        memcpy(local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,local_290,local_280 * 8);
      }
    }
    else {
      local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_290;
      local_548.lcr_.super_BasicConstraint.name_._M_string_length = local_288;
      local_288 = 6;
      local_280 = 0;
      local_290 = local_278;
    }
    tVar6 = local_238;
    if ((ulong)local_240 < 7) {
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[2] =
           (type)((long)&local_548.lcr_.super_LinTerms.coefs_.
                         super_small_vector_base<std::allocator<double>,_6U> + 0x40);
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[3] = (type)0x6;
      if (local_238 != (type)0x0) {
        memcpy((void *)local_548.lcr_.super_LinTerms.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data
                       [2],(void *)local_248,(long)local_238 * 4);
      }
    }
    else {
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[2] = local_248;
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[3] = local_240;
      local_240 = (type)0x6;
      local_238 = (type)0x0;
      local_248 = (type)local_230;
    }
    local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    m_storage.m_data[4] = tVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548.super_BasicConstraint.name_._M_dataplus._M_p == paVar1) {
      local_478._24_8_ = local_548.super_BasicConstraint.name_.field_2._8_8_;
      local_478._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_478 + 0x10);
    }
    else {
      local_478._0_8_ = local_548.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_478._17_7_ = local_548.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_;
    local_478[0x10] = local_548.super_BasicConstraint.name_.field_2._M_local_buf[0];
    local_478._8_8_ = local_548.super_BasicConstraint.name_._M_string_length;
    local_548.super_BasicConstraint.name_._M_string_length = 0;
    local_548.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = (size_ty)dVar5;
    if (local_548.lcr_.super_BasicConstraint.name_._M_string_length < 7) {
      local_478._32_8_ = local_478 + 0x38;
      local_478._40_8_ = 6;
      local_548.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
      if (local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity != 0) {
        memcpy((void *)local_478._32_8_,local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
               local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity * 8);
      }
    }
    else {
      local_478._32_8_ = local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p;
      local_478._40_8_ = local_548.lcr_.super_BasicConstraint.name_._M_string_length;
      local_548.lcr_.super_BasicConstraint.name_._M_string_length = 6;
      local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity = 0;
      local_548.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
      local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)((long)&local_548.lcr_.super_BasicConstraint.name_.field_2 + 8);
    }
    if ((ulong)local_548.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3] < 7) {
      local_410 = (type)((long)local_478 + 0x80);
      local_408 = (type)0x6;
      if (local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
          m_data.m_storage.m_data[4] != (type)0x0) {
        memcpy((void *)local_410,
               (void *)local_548.lcr_.super_LinTerms.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data
                       [2],
               (long)local_548.lcr_.super_LinTerms.coefs_.
                     super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4]
               * 4);
      }
    }
    else {
      local_410 = local_548.lcr_.super_LinTerms.coefs_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2];
      local_408 = local_548.lcr_.super_LinTerms.coefs_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3];
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[3] = (type)0x6;
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[4] = (type)0x0;
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.m_storage.m_data[2] =
           (type)((long)&local_548.lcr_.super_LinTerms.coefs_.
                         super_small_vector_base<std::allocator<double>,_6U> + 0x40);
    }
    local_3e0.rhs_ =
         (double)local_548.lcr_.super_LinTerms.vars_.
                 super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    NVar11 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)this_00,
                        (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)local_478);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(this_00,NVar11);
    if (6 < (ulong)local_408) {
      operator_delete((void *)local_410,(long)local_408 << 2);
    }
    if (6 < (ulong)local_478._40_8_) {
      operator_delete((void *)local_478._32_8_,local_478._40_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_478 + 0x10)) {
      operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
    }
    if (6 < (ulong)local_548.lcr_.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3]) {
      operator_delete((void *)local_548.lcr_.super_LinTerms.coefs_.
                              super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.
                              m_data[2],
                      (long)local_548.lcr_.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.
                            m_data[3] << 2);
    }
    if (6 < local_548.lcr_.super_BasicConstraint.name_._M_string_length) {
      operator_delete(local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_548.lcr_.super_BasicConstraint.name_._M_string_length << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548.super_BasicConstraint.name_._M_dataplus._M_p != paVar1) goto LAB_001876fc;
  }
  else {
    if (local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0 ||
        local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
        != 0) goto LAB_00187231;
    v = -1;
LAB_001873ea:
    bVar9 = 0;
LAB_001873ec:
    CVar8 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                      ((BasicConstraintKeeper *)(this + 0x1068));
    if ((bool)(~bVar9 & CVar8 == Recommended)) {
      bVar7 = false;
      goto LAB_0018770b;
    }
LAB_00187406:
    rng.ub_ = dVar5;
    rng.lb_ = -INFINITY;
    NLConstraint::NLConstraint(&local_548,(LinTerms *)local_308,v,rng,false);
    paVar3 = &local_3d8.super_BasicConstraint.name_.field_2;
    paVar1 = &local_548.super_BasicConstraint.name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548.super_BasicConstraint.name_._M_dataplus._M_p == paVar1) {
      local_3d8.super_BasicConstraint.name_.field_2._8_8_ =
           local_548.super_BasicConstraint.name_.field_2._8_8_;
      local_3d8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3d8.super_BasicConstraint.name_._M_dataplus._M_p =
           local_548.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_3d8.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_ =
         local_548.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_;
    local_3d8.super_BasicConstraint.name_.field_2._M_local_buf[0] =
         local_548.super_BasicConstraint.name_.field_2._M_local_buf[0];
    paVar2 = &local_548.lcr_.super_BasicConstraint.name_.field_2;
    paVar4 = &local_3d8.lcr_.super_BasicConstraint.name_.field_2;
    local_3d8.super_BasicConstraint.name_._M_string_length =
         local_548.super_BasicConstraint.name_._M_string_length;
    local_548.super_BasicConstraint.name_._M_string_length = 0;
    local_548.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p == paVar2) {
      local_3d8.lcr_.super_BasicConstraint.name_.field_2._8_8_ =
           local_548.lcr_.super_BasicConstraint.name_.field_2._8_8_;
      local_3d8.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_3d8.lcr_.super_BasicConstraint.name_._M_dataplus._M_p =
           local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_3d8.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity;
    local_3d8.lcr_.super_BasicConstraint.name_._M_string_length =
         local_548.lcr_.super_BasicConstraint.name_._M_string_length;
    local_548.lcr_.super_BasicConstraint.name_._M_string_length = 0;
    local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity &
         0xffffffffffffff00;
    local_548.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
    local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
    if (local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_3d8.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_3d8.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_3d8.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_3d8.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_548.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_548.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_3d8.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_3d8.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_548.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U> + 0x18);
    }
    if (local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_3d8.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_3d8.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_3d8.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if ((double)local_548.lcr_.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>.m_data.
                  super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0.0) {
        memcpy(local_3d8.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_3d8.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
           m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_3d8.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
           m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_548.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U> + 0x18);
    }
    local_3d8.lcr_.super_AlgConRange.lb_ = local_548.lcr_.super_AlgConRange.lb_;
    local_3d8.lcr_.super_AlgConRange.ub_ = local_548.lcr_.super_AlgConRange.ub_;
    local_3d8.expr_ = local_548.expr_;
    NVar11 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddConstraintAndTryNoteResultVariable<mp::NLConstraint>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)(this + -0x208),&local_3d8);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)(this + -0x208),NVar11);
    if (6 < local_3d8.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3d8.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3d8.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3d8.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3d8.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3d8.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.lcr_.super_BasicConstraint.name_._M_dataplus._M_p != paVar4) {
      operator_delete(local_3d8.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_3d8.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.super_BasicConstraint.name_._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_3d8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < local_548.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_548.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_548.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_548.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_548.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_548.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p != paVar2) {
      operator_delete(local_548.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_548.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548.super_BasicConstraint.name_._M_dataplus._M_p != paVar1) {
LAB_001876fc:
      operator_delete(local_548.super_BasicConstraint.name_._M_dataplus._M_p,
                      CONCAT71(local_548.super_BasicConstraint.name_.field_2._M_allocated_capacity.
                               _1_7_,local_548.super_BasicConstraint.name_.field_2._M_local_buf[0])
                      + 1);
    }
  }
  bVar7 = true;
LAB_0018770b:
  if (6 < local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_218.quad_expr_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_218.quad_expr_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_218.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
    operator_delete(local_218.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                    _M_p,local_218.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                         _M_allocated_capacity + 1);
  }
  if (6 < local_2b8) {
    operator_delete(local_2c0,local_2b8 << 2);
  }
  if (6 < (ulong)local_308._8_8_) {
    operator_delete((void *)local_308._0_8_,local_308._8_8_ << 3);
  }
  return bVar7;
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }